

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O2

ssize_t __thiscall InputSource::read(InputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  if (-1 < (long)__nbytes) {
    (*this->_vptr_InputSource[5])(this,__nbytes,0);
  }
  std::__cxx11::string::resize((ulong)puVar1);
  (*this->_vptr_InputSource[7])(this,*puVar1,__buf);
  std::__cxx11::string::resize((ulong)puVar1);
  return puVar1[1];
}

Assistant:

inline size_t
InputSource::read(std::string& str, size_t count, qpdf_offset_t at)
{
    if (at >= 0) {
        seek(at, SEEK_SET);
    }
    str.resize(count);
    str.resize(read(str.data(), count));
    return str.size();
}